

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::vkRelaxedRemapFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TParameter *pTVar4;
  TIntermConstantUnion *pTVar5;
  TIntermAggregate *pTVar6;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int i;
  uint uVar8;
  TParameter tmpP;
  TParameter local_268;
  TString name;
  TType uintType;
  TFunction realFunc;
  
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
  if (iVar3 == 0) {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var,iVar3),"atomicCounterIncrement");
    if (bVar2) {
      realFunc.super_TSymbol._vptr_TSymbol = (_func_int **)GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&name,
                 "atomicAdd",(pool_allocator<char> *)&realFunc);
      TType::TType(&uintType,EbtUint,EvqTemporary,1,0,0,false);
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TFunction::TFunction(&realFunc,&name,(TType *)CONCAT44(extraout_var_00,iVar3),EOpNull);
      for (uVar8 = 0; iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function),
          (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
        tmpP.name = (TString *)0x0;
        tmpP.type = (TType *)0x0;
        tmpP.defaultValue = (TIntermTyped *)0x0;
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar8);
        pTVar4 = TParameter::copyParam(&tmpP,(TParameter *)CONCAT44(extraout_var_01,iVar3));
        TFunction::addParameter(&realFunc,pTVar4);
      }
      tmpP.name = (TString *)0x0;
      tmpP.type = &uintType;
      tmpP.defaultValue = (TIntermTyped *)0x0;
      local_268.name = (TString *)0x0;
      local_268.type = (TType *)0x0;
      local_268.defaultValue = (TIntermTyped *)0x0;
      pTVar4 = TParameter::copyParam(&local_268,&tmpP);
      TFunction::addParameter(&realFunc,pTVar4);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar5 = TIntermediate::addConstantUnion(pTVar1,1,loc,true);
      pTVar6 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar5);
      pTVar7 = handleFunctionCall(this,loc,&realFunc,(TIntermNode *)pTVar6);
    }
    else {
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_02,iVar3),"atomicCounterDecrement");
      if (!bVar2) {
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_05,iVar3),"atomicCounter");
        if (arguments == (TIntermNode *)0x0) {
          return (TIntermTyped *)0x0;
        }
        if (!bVar2) {
          return (TIntermTyped *)0x0;
        }
        iVar3 = (*arguments->_vptr_TIntermNode[3])(arguments);
        if (CONCAT44(extraout_var_06,iVar3) != 0) {
          iVar3 = (*arguments->_vptr_TIntermNode[3])(arguments);
          return (TIntermTyped *)CONCAT44(extraout_var_07,iVar3);
        }
        goto LAB_004100a1;
      }
      realFunc.super_TSymbol._vptr_TSymbol = (_func_int **)GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&name,
                 "atomicAdd",(pool_allocator<char> *)&realFunc);
      TType::TType(&uintType,EbtUint,EvqTemporary,1,0,0,false);
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TFunction::TFunction(&realFunc,&name,(TType *)CONCAT44(extraout_var_03,iVar3),EOpNull);
      for (uVar8 = 0; iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function),
          (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
        tmpP.name = (TString *)0x0;
        tmpP.type = (TType *)0x0;
        tmpP.defaultValue = (TIntermTyped *)0x0;
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar8);
        pTVar4 = TParameter::copyParam(&tmpP,(TParameter *)CONCAT44(extraout_var_04,iVar3));
        TFunction::addParameter(&realFunc,pTVar4);
      }
      tmpP.name = (TString *)0x0;
      tmpP.type = &uintType;
      tmpP.defaultValue = (TIntermTyped *)0x0;
      local_268.name = (TString *)0x0;
      local_268.type = (TType *)0x0;
      local_268.defaultValue = (TIntermTyped *)0x0;
      pTVar4 = TParameter::copyParam(&local_268,&tmpP);
      TFunction::addParameter(&realFunc,pTVar4);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar5 = TIntermediate::addConstantUnion(pTVar1,-1,loc,true);
      pTVar6 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar5);
      pTVar7 = handleFunctionCall(this,loc,&realFunc,(TIntermNode *)pTVar6);
      if (pTVar7 == (TIntermTyped *)0x0) {
        pTVar7 = (TIntermTyped *)0x0;
      }
      else {
        pTVar5 = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,loc,
                            true);
        pTVar7 = handleBinaryMath(this,loc,"-",EOpSub,pTVar7,&pTVar5->super_TIntermTyped);
      }
    }
    TFunction::~TFunction(&realFunc);
  }
  else {
LAB_004100a1:
    pTVar7 = (TIntermTyped *)0x0;
  }
  return pTVar7;
}

Assistant:

TIntermTyped* TParseContext::vkRelaxedRemapFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (function->getBuiltInOp() != EOpNull) {
        return nullptr;
    }

    if (function->getName() == "atomicCounterIncrement") {
        // change atomicCounterIncrement into an atomicAdd of 1
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        // Use copyParam to avoid shared ownership of the 'type' field
        // of the parameter.
        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);
    } else if (function->getName() == "atomicCounterDecrement") {
        // change atomicCounterDecrement into an atomicAdd with -1
        // and subtract 1 from result, to return post-decrement value
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(-1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);

        // post decrement, so that it matches AtomicCounterDecrement semantics
        if (result) {
            result = handleBinaryMath(loc, "-", EOpSub, result, intermediate.addConstantUnion(1, loc, true));
        }
    } else if (function->getName() == "atomicCounter") {
        // change atomicCounter into a direct read of the variable
        if (arguments && arguments->getAsTyped()) {
            result = arguments->getAsTyped();
        }
    }

    return result;
}